

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O2

bool __thiscall
QOpenGLTextureBlitterPrivate::prepareProgram
          (QOpenGLTextureBlitterPrivate *this,QMatrix4x4 *vertexTransform)

{
  float *pfVar1;
  float value;
  bool bVar2;
  ProgramIndex idx;
  socklen_t in_ECX;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ProgramIndex __fd;
  GLuint location;
  Program *pPVar3;
  
  idx = targetToProgramIndex(this->currentTarget);
  __fd = idx;
  bVar2 = ensureProgram(this,idx);
  if (bVar2) {
    pPVar3 = this->programs + idx;
    QOpenGLBuffer::bind(&this->vertexBuffer,__fd,__addr,in_ECX);
    __len = 0;
    QOpenGLShaderProgram::setAttributeBuffer
              ((pPVar3->glProgram).d,this->programs[idx].vertexCoordAttribPos,0x1406,0,3,0);
    QOpenGLShaderProgram::enableAttributeArray
              ((pPVar3->glProgram).d,this->programs[idx].vertexCoordAttribPos);
    QOpenGLBuffer::release(&this->vertexBuffer);
    location = this->programs[idx].vertexTransformUniformPos;
    QOpenGLShaderProgram::setUniformValue((pPVar3->glProgram).d,location,vertexTransform);
    QOpenGLBuffer::bind(&this->textureBuffer,location,__addr_00,__len);
    QOpenGLShaderProgram::setAttributeBuffer
              ((pPVar3->glProgram).d,this->programs[idx].textureCoordAttribPos,0x1406,0,2,0);
    QOpenGLShaderProgram::enableAttributeArray
              ((pPVar3->glProgram).d,this->programs[idx].textureCoordAttribPos);
    QOpenGLBuffer::release(&this->textureBuffer);
    if (this->swizzle != this->programs[idx].swizzle) {
      QOpenGLShaderProgram::setUniformValue
                ((pPVar3->glProgram).d,this->programs[idx].swizzleUniformPos,(uint)this->swizzle);
      this->programs[idx].swizzle = this->swizzle;
    }
    value = this->opacity;
    pfVar1 = &this->programs[idx].opacity;
    if ((value != *pfVar1) || (NAN(value) || NAN(*pfVar1))) {
      QOpenGLShaderProgram::setUniformValue
                ((pPVar3->glProgram).d,this->programs[idx].opacityUniformPos,value);
      this->programs[idx].opacity = this->opacity;
    }
  }
  return bVar2;
}

Assistant:

bool QOpenGLTextureBlitterPrivate::prepareProgram(const QMatrix4x4 &vertexTransform)
{
    ProgramIndex programIndex = targetToProgramIndex(currentTarget);
    if (!ensureProgram(programIndex))
        return false;

    Program *program = &programs[programIndex];

    vertexBuffer.bind();
    program->glProgram->setAttributeBuffer(program->vertexCoordAttribPos, GL_FLOAT, 0, 3, 0);
    program->glProgram->enableAttributeArray(program->vertexCoordAttribPos);
    vertexBuffer.release();

    program->glProgram->setUniformValue(program->vertexTransformUniformPos, vertexTransform);

    textureBuffer.bind();
    program->glProgram->setAttributeBuffer(program->textureCoordAttribPos, GL_FLOAT, 0, 2, 0);
    program->glProgram->enableAttributeArray(program->textureCoordAttribPos);
    textureBuffer.release();

    if (swizzle != program->swizzle) {
        program->glProgram->setUniformValue(program->swizzleUniformPos, swizzle);
        program->swizzle = swizzle;
    }

    if (opacity != program->opacity) {
        program->glProgram->setUniformValue(program->opacityUniformPos, opacity);
        program->opacity = opacity;
    }

    return true;
}